

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLog::WriteCreateSchema(WriteAheadLog *this,SchemaCatalogEntry *entry)

{
  BinarySerializer *this_00;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer local_5c0;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&local_5c0,this,CREATE_SCHEMA);
  this_00 = &local_5c0.serializer;
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"schema");
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[0x1c])
            (this_00,&(entry->super_InCatalogEntry).super_CatalogEntry.name);
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&local_5c0.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&local_5c0);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateSchema(const SchemaCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_SCHEMA);
	serializer.WriteProperty(101, "schema", entry.name);
	serializer.End();
}